

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase710::run(TestCase710 *this)

{
  bool bVar1;
  __pid_t _Var2;
  AsyncIoProvider *pAVar3;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> *pOVar4;
  AsyncCapabilityStream *pAVar5;
  undefined4 extraout_var;
  AsyncOutputStream *pAVar6;
  size_t size;
  ArrayPtr<const_unsigned_char> AVar7;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> *local_598;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> *local_490;
  bool local_41a;
  undefined1 auStack_418 [6];
  bool _kj_shouldLog_3;
  AsyncInputStream local_400;
  String local_3f8;
  DebugExpression<kj::String> local_3e0;
  undefined1 local_3c8 [8];
  DebugComparison<kj::String,_const_char_(&)[4]> _kjCondition_4;
  SourceLocation local_388;
  ArrayPtr<const_unsigned_char> local_370;
  Promise<void> local_360;
  bool local_352;
  undefined1 auStack_350 [6];
  bool _kj_shouldLog_2;
  AsyncInputStream local_338;
  String local_330;
  DebugExpression<kj::String> local_318;
  undefined1 local_300 [8];
  DebugComparison<kj::String,_const_char_(&)[4]> _kjCondition_3;
  SourceLocation local_2c0;
  ArrayPtr<const_unsigned_char> local_2a8;
  Promise<void> local_298;
  Fault local_290;
  Fault f;
  unsigned_long *local_280;
  undefined1 local_278 [8];
  DebugComparison<unsigned_long_&,_int> _kjCondition_2;
  undefined1 local_248 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_238;
  undefined1 local_228 [8];
  DebugComparison<kj::StringPtr,_const_char_(&)[7]> _kjCondition_1;
  bool _kj_shouldLog;
  DebugExpression<unsigned_long_&> DStack_1f0;
  undefined1 local_1e8 [8];
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  SourceLocation local_1b8;
  Promise<kj::AsyncCapabilityStream::ReadResult> local_1a0;
  unsigned_long local_198;
  ReadResult result;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> receiveStreams [3];
  char local_150 [6];
  undefined1 local_14a;
  char receiveBuffer [7];
  Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> local_130;
  ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> local_118;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> local_108;
  ArrayPtr<const_unsigned_char> local_f8;
  Promise<void> local_e8;
  undefined1 local_e0 [8];
  ArrayPtr<const_unsigned_char> secondBuf;
  ArrayBuilder<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> streams;
  CapabilityPipe pipe3;
  CapabilityPipe pipe2;
  undefined1 local_60 [8];
  CapabilityPipe pipe;
  AsyncIoContext ioContext;
  TestCase710 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  setupAsyncIo();
  pAVar3 = Own<kj::AsyncIoProvider,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)&ioContext.lowLevelProvider.ptr);
  (*pAVar3->_vptr_AsyncIoProvider[2])(local_60);
  pAVar3 = Own<kj::AsyncIoProvider,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)&ioContext.lowLevelProvider.ptr);
  (*pAVar3->_vptr_AsyncIoProvider[2])(&pipe3.ends[1].ptr);
  pAVar3 = Own<kj::AsyncIoProvider,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)&ioContext.lowLevelProvider.ptr);
  (*pAVar3->_vptr_AsyncIoProvider[2])(&streams.disposer);
  heapArrayBuilder<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>
            ((ArrayBuilder<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> *)&secondBuf.size_,
             (kj *)0x2,size);
  pOVar4 = mv<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>
                     ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&pipe3.ends[1].ptr);
  ArrayBuilder<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>::
  add<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>
            ((ArrayBuilder<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>> *)&secondBuf.size_,
             pOVar4);
  pOVar4 = mv<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>
                     ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&streams.disposer);
  ArrayBuilder<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>::
  add<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>
            ((ArrayBuilder<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>> *)&secondBuf.size_,
             pOVar4);
  AVar7 = operator___kjb<kj::_::ByteLiteral<4UL>__98,_97,_114__>();
  secondBuf.ptr = (uchar *)AVar7.size_;
  local_e0 = (undefined1  [8])AVar7.ptr;
  pAVar5 = Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)local_60);
  local_f8 = operator___kjb<kj::_::ByteLiteral<4UL>__102,_111,_111__>();
  local_118 = arrayPtr<kj::ArrayPtr<unsigned_char_const>>
                        ((ArrayPtr<const_unsigned_char> *)local_e0,1);
  local_108 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_118);
  ArrayBuilder<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>::finish
            (&local_130,
             (ArrayBuilder<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> *)&secondBuf.size_);
  (*(pAVar5->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[0x10])
            (&local_e8,pAVar5,local_f8.ptr,local_f8.size_,local_108.ptr,local_108.size_,&local_130);
  pAVar3 = ioContext.provider.ptr;
  SourceLocation::SourceLocation
            ((SourceLocation *)receiveBuffer,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x2d2,3);
  Promise<void>::wait(&local_e8,pAVar3);
  Promise<void>::~Promise(&local_e8);
  Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>::~Array(&local_130);
  memset(local_150,0,7);
  local_490 = (Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&result.capCount;
  do {
    Own<kj::AsyncCapabilityStream,_std::nullptr_t>::Own(local_490);
    local_490 = local_490 + 1;
  } while (local_490 != (Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&receiveStreams[2].ptr);
  pAVar5 = Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&pipe.ends[0].ptr);
  (*(pAVar5->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[0x11])
            (&local_1a0,pAVar5,local_150,6,7,&result.capCount,3);
  pAVar3 = ioContext.provider.ptr;
  SourceLocation::SourceLocation
            (&local_1b8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x2d7,0x11);
  _Var2 = Promise<kj::AsyncCapabilityStream::ReadResult>::wait(&local_1a0,pAVar3);
  local_198 = CONCAT44(extraout_var,_Var2);
  Promise<kj::AsyncCapabilityStream::ReadResult>::~Promise(&local_1a0);
  DStack_1f0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_198);
  _kjCondition_1._44_4_ = 6;
  kj::_::DebugExpression<unsigned_long&>::operator==
            ((DebugComparison<unsigned_long_&,_int> *)local_1e8,
             (DebugExpression<unsigned_long&> *)&stack0xfffffffffffffe10,
             (int *)&_kjCondition_1.field_0x2c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e8);
  if (!bVar1) {
    _kjCondition_1._43_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._43_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<unsigned_long&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x2da,ERROR,"\"failed: expected \" \"result.byteCount == 6\", _kjCondition",
                 (char (*) [39])"failed: expected result.byteCount == 6",
                 (DebugComparison<unsigned_long_&,_int> *)local_1e8);
      _kjCondition_1._43_1_ = 0;
    }
  }
  local_14a = 0;
  StringPtr::StringPtr((StringPtr *)local_248,local_150);
  local_238 = (ArrayPtr<const_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StringPtr *)local_248);
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[7]> *)local_228,
             (DebugExpression<kj::StringPtr> *)&local_238,(char (*) [7])0x942b88);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_228);
  if (!bVar1) {
    _kjCondition_2._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::StringPtr,char_const(&)[7]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x2dc,ERROR,
                 "\"failed: expected \" \"kj::StringPtr(receiveBuffer) == \\\"foobar\\\"\", _kjCondition"
                 ,(char (*) [58])"failed: expected kj::StringPtr(receiveBuffer) == \"foobar\"",
                 (DebugComparison<kj::StringPtr,_const_char_(&)[7]> *)local_228);
      _kjCondition_2._39_1_ = 0;
    }
  }
  local_280 = (unsigned_long *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&result.byteCount);
  f.exception._4_4_ = 2;
  kj::_::DebugExpression<unsigned_long&>::operator==
            ((DebugComparison<unsigned_long_&,_int> *)local_278,
             (DebugExpression<unsigned_long&> *)&local_280,(int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_278);
  if (bVar1) {
    pAVar5 = Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator->
                       ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&result.capCount);
    pAVar6 = &(pAVar5->super_AsyncIoStream).super_AsyncOutputStream;
    local_2a8 = operator___kjb<kj::_::ByteLiteral<4UL>__98,_97,_122__>();
    (**pAVar6->_vptr_AsyncOutputStream)(&local_298,pAVar6,local_2a8.ptr,local_2a8.size_);
    pAVar3 = ioContext.provider.ptr;
    SourceLocation::SourceLocation
              (&local_2c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,"run",0x2e0,3);
    Promise<void>::wait(&local_298,pAVar3);
    Promise<void>::~Promise(&local_298);
    Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator=
              ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&result.capCount,(void *)0x0);
    pAVar5 = Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator->
                       ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&pipe2.ends[0].ptr);
    MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&kj::maxValue);
    AsyncInputStream::readAllText(&local_338,(uint64_t)pAVar5);
    SourceLocation::SourceLocation
              ((SourceLocation *)auStack_350,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,"run",0x2e2,0x4c);
    Promise<kj::String>::wait((Promise<kj::String> *)&local_330,&local_338);
    kj::_::DebugExpressionStart::operator<<
              (&local_318,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_330);
    kj::_::DebugExpression<kj::String>::operator==
              ((DebugComparison<kj::String,_const_char_(&)[4]> *)local_300,&local_318,
               (char (*) [4])0x91ea93);
    kj::_::DebugExpression<kj::String>::~DebugExpression(&local_318);
    String::~String(&local_330);
    Promise<kj::String>::~Promise((Promise<kj::String> *)&local_338);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_300);
    if (!bVar1) {
      local_352 = kj::_::Debug::shouldLog(ERROR);
      while (local_352 != false) {
        kj::_::Debug::log<char_const(&)[81],kj::_::DebugComparison<kj::String,char_const(&)[4]>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                   ,0x2e2,ERROR,
                   "\"failed: expected \" \"pipe2.ends[1]->readAllText().wait(ioContext.waitScope) == \\\"baz\\\"\", _kjCondition"
                   ,(char (*) [81])
                    "failed: expected pipe2.ends[1]->readAllText().wait(ioContext.waitScope) == \"baz\""
                   ,(DebugComparison<kj::String,_const_char_(&)[4]> *)local_300);
        local_352 = false;
      }
    }
    kj::_::DebugComparison<kj::String,_const_char_(&)[4]>::~DebugComparison
              ((DebugComparison<kj::String,_const_char_(&)[4]> *)local_300);
    pAVar5 = Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator->
                       ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&pipe3.ends[0].ptr);
    pAVar6 = &(pAVar5->super_AsyncIoStream).super_AsyncOutputStream;
    local_370 = operator___kjb<kj::_::ByteLiteral<4UL>__113,_117,_120__>();
    (**pAVar6->_vptr_AsyncOutputStream)(&local_360,pAVar6,local_370.ptr,local_370.size_);
    SourceLocation::SourceLocation
              (&local_388,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,"run",0x2e4,3);
    Promise<void>::wait(&local_360,ioContext.provider.ptr);
    Promise<void>::~Promise(&local_360);
    Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator=
              ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&pipe3.ends[0].ptr,(void *)0x0);
    pAVar5 = Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator->
                       ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&receiveStreams[0].ptr);
    MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&kj::maxValue);
    AsyncInputStream::readAllText(&local_400,(uint64_t)pAVar5);
    SourceLocation::SourceLocation
              ((SourceLocation *)auStack_418,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,"run",0x2e6,0x50);
    Promise<kj::String>::wait((Promise<kj::String> *)&local_3f8,&local_400);
    kj::_::DebugExpressionStart::operator<<
              (&local_3e0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3f8);
    kj::_::DebugExpression<kj::String>::operator==
              ((DebugComparison<kj::String,_const_char_(&)[4]> *)local_3c8,&local_3e0,
               (char (*) [4])0x9181e4);
    kj::_::DebugExpression<kj::String>::~DebugExpression(&local_3e0);
    String::~String(&local_3f8);
    Promise<kj::String>::~Promise((Promise<kj::String> *)&local_400);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3c8);
    if (!bVar1) {
      local_41a = kj::_::Debug::shouldLog(ERROR);
      while (local_41a != false) {
        kj::_::Debug::log<char_const(&)[85],kj::_::DebugComparison<kj::String,char_const(&)[4]>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                   ,0x2e6,ERROR,
                   "\"failed: expected \" \"receiveStreams[1]->readAllText().wait(ioContext.waitScope) == \\\"qux\\\"\", _kjCondition"
                   ,(char (*) [85])
                    "failed: expected receiveStreams[1]->readAllText().wait(ioContext.waitScope) == \"qux\""
                   ,(DebugComparison<kj::String,_const_char_(&)[4]> *)local_3c8);
        local_41a = false;
      }
    }
    kj::_::DebugComparison<kj::String,_const_char_(&)[4]>::~DebugComparison
              ((DebugComparison<kj::String,_const_char_(&)[4]> *)local_3c8);
    local_598 = (Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&receiveStreams[2].ptr;
    do {
      local_598 = local_598 + -1;
      Own<kj::AsyncCapabilityStream,_std::nullptr_t>::~Own(local_598);
    } while (local_598 != (Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&result.capCount);
    ArrayBuilder<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>::~ArrayBuilder
              ((ArrayBuilder<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> *)&secondBuf.size_
              );
    CapabilityPipe::~CapabilityPipe((CapabilityPipe *)&streams.disposer);
    CapabilityPipe::~CapabilityPipe((CapabilityPipe *)&pipe3.ends[1].ptr);
    CapabilityPipe::~CapabilityPipe((CapabilityPipe *)local_60);
    AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&pipe.ends[1].ptr);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&>
            (&local_290,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,0x2de,FAILED,"result.capCount == 2","_kjCondition,",
             (DebugComparison<unsigned_long_&,_int> *)local_278);
  kj::_::Debug::Fault::fatal(&local_290);
}

Assistant:

TEST(AsyncIo, CapabilityPipeMultiStreamMessage) {
  auto ioContext = setupAsyncIo();

  auto pipe = ioContext.provider->newCapabilityPipe();
  auto pipe2 = ioContext.provider->newCapabilityPipe();
  auto pipe3 = ioContext.provider->newCapabilityPipe();

  auto streams = heapArrayBuilder<Own<AsyncCapabilityStream>>(2);
  streams.add(kj::mv(pipe2.ends[0]));
  streams.add(kj::mv(pipe3.ends[0]));

  ArrayPtr<const byte> secondBuf = "bar"_kjb;
  pipe.ends[0]->writeWithStreams("foo"_kjb, arrayPtr(&secondBuf, 1), streams.finish())
      .wait(ioContext.waitScope);

  char receiveBuffer[7]{};
  Own<AsyncCapabilityStream> receiveStreams[3];
  auto result = pipe.ends[1]->tryReadWithStreams(receiveBuffer, 6, 7, receiveStreams, 3)
      .wait(ioContext.waitScope);

  KJ_EXPECT(result.byteCount == 6);
  receiveBuffer[6] = '\0';
  KJ_EXPECT(kj::StringPtr(receiveBuffer) == "foobar");

  KJ_ASSERT(result.capCount == 2);

  receiveStreams[0]->write("baz"_kjb).wait(ioContext.waitScope);
  receiveStreams[0] = nullptr;
  KJ_EXPECT(pipe2.ends[1]->readAllText().wait(ioContext.waitScope) == "baz");

  pipe3.ends[1]->write("qux"_kjb).wait(ioContext.waitScope);
  pipe3.ends[1] = nullptr;
  KJ_EXPECT(receiveStreams[1]->readAllText().wait(ioContext.waitScope) == "qux");
}